

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::IsIntScalarOrVectorType(ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  uint32_t id_00;
  Instruction *pIVar2;
  
  pIVar2 = FindDef(this,id);
  if (pIVar2 != (Instruction *)0x0) {
    uVar1 = (pIVar2->inst_).opcode;
    if (uVar1 == 0x15) {
      return true;
    }
    if (uVar1 == 0x17) {
      id_00 = GetComponentType(this,id);
      pIVar2 = FindDef(this,id_00);
      if (pIVar2 != (Instruction *)0x0) {
        return (pIVar2->inst_).opcode == 0x15;
      }
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsIntScalarOrVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeInt) {
    return true;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsIntScalarType(GetComponentType(id));
  }

  return false;
}